

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type this_00;
  value_type vVar2;
  char *file;
  key_type rhs_expression;
  uint *lhs;
  AssertHelper *this_01;
  AssertHelper *this_02;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht2_2;
  TypeParam ht1_2;
  AssertionResult gtest_ar;
  TypeParam ht2_1;
  TypeParam ht1_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff780;
  HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff788;
  hasher *in_stack_fffffffffffff790;
  char *in_stack_fffffffffffff798;
  int line;
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff7a0;
  undefined8 in_stack_fffffffffffff7a8;
  Type TVar3;
  AssertHelper *in_stack_fffffffffffff7b0;
  char *in_stack_fffffffffffff7e0;
  char *in_stack_fffffffffffff7e8;
  char *in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  uint i;
  AssertHelper *in_stack_fffffffffffff800;
  AssertionResult local_760;
  value_type *in_stack_fffffffffffff8b8;
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8c0;
  AssertionResult local_730 [6];
  value_type local_6c8;
  key_type local_6c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_6b8 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_5f0 [13];
  size_type local_518;
  undefined4 local_50c;
  AssertionResult local_508 [6];
  value_type local_4a0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_498 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3d0 [12];
  string local_308 [55];
  undefined1 local_2d1;
  AssertionResult local_2d0;
  string local_2c0 [55];
  byte local_289;
  AssertionResult local_288 [6];
  value_type local_220;
  value_type local_1c0;
  key_type local_1b8;
  key_type local_1b0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1a8 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d0 [13];
  
  TVar3 = (Type)((ulong)in_stack_fffffffffffff7a8 >> 0x20);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_d0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffff7a0,(size_type)in_stack_fffffffffffff798,
             in_stack_fffffffffffff790,(key_equal *)in_stack_fffffffffffff788,
             (allocator_type *)in_stack_fffffffffffff780);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d0);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_1a8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffff7a0,(size_type)in_stack_fffffffffffff798,
             in_stack_fffffffffffff790,(key_equal *)in_stack_fffffffffffff788,
             (allocator_type *)in_stack_fffffffffffff780);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_1a8);
  local_1b0 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff780,
                    (key_type *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_1b8 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff780,
                    (key_type *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_1c0 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),0);
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  local_220 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),0);
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==(in_stack_fffffffffffff780,
                       (BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_289 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff780,
             (bool *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),(type *)0xb7ba5d)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_288);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff7b0,TVar3,(char *)in_stack_fffffffffffff7a0,
               (int)((ulong)in_stack_fffffffffffff798 >> 0x20),(char *)in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    std::__cxx11::string::~string(local_2c0);
    testing::Message::~Message((Message *)0xb7bba1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7bc38);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff780,
              (HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_2d1 = google::
              BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==(in_stack_fffffffffffff780,
                           (BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff780,
             (bool *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),(type *)0xb7bc96)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff7b0,TVar3,(char *)in_stack_fffffffffffff7a0,
               (int)((ulong)in_stack_fffffffffffff798 >> 0x20),(char *)in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    std::__cxx11::string::~string(local_308);
    testing::Message::~Message((Message *)0xb7bd6b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7be02);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7be0f);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7be1c);
  i = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  this_02 = (AssertHelper *)(ulong)i;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_3d0,i,(int *)this_02);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffff7a0,(size_type)in_stack_fffffffffffff798,
             in_stack_fffffffffffff790,(key_equal *)in_stack_fffffffffffff788,
             (allocator_type *)in_stack_fffffffffffff780);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_3d0);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_498,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffff7a0,(size_type)in_stack_fffffffffffff798,
             in_stack_fffffffffffff790,(key_equal *)in_stack_fffffffffffff788,
             (allocator_type *)in_stack_fffffffffffff780);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_498);
  local_4a0 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),0);
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff780,
              (HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_50c = 0;
  local_518 = google::
              BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xb7bf99);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff798,(char *)in_stack_fffffffffffff790,
             (uint *)in_stack_fffffffffffff788,(unsigned_long *)in_stack_fffffffffffff780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7b0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb7c0bb);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff7b0,TVar3,(char *)in_stack_fffffffffffff7a0,
               (int)((ulong)in_stack_fffffffffffff798 >> 0x20),(char *)in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    testing::Message::~Message((Message *)0xb7c118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7c189);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7c196);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7c1a3);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_5f0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffff7a0,(size_type)in_stack_fffffffffffff798,
             in_stack_fffffffffffff790,(key_equal *)in_stack_fffffffffffff788,
             (allocator_type *)in_stack_fffffffffffff780);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_5f0);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_6b8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffff7a0,(size_type)in_stack_fffffffffffff798,
             in_stack_fffffffffffff790,(key_equal *)in_stack_fffffffffffff788,
             (allocator_type *)in_stack_fffffffffffff780);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_6b8);
  this_00 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20));
  local_6c0 = this_00;
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff780,
                    (key_type *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  vVar2 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),0);
  local_6c8 = vVar2;
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  TVar3 = vVar2.second;
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff780,
              (HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  file = (char *)google::
                 BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::size((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xb7c33c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff798,(char *)in_stack_fffffffffffff790,
             (uint *)in_stack_fffffffffffff788,(unsigned_long *)in_stack_fffffffffffff780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_730);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff798 =
         testing::AssertionResult::failure_message((AssertionResult *)0xb7c45e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,TVar3,file,(int)((ulong)in_stack_fffffffffffff798 >> 0x20),
               (char *)in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff780);
    testing::Message::~Message((Message *)0xb7c4bb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7c52c);
  rhs_expression =
       HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20));
  lhs = (uint *)google::
                BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::count(in_stack_fffffffffffff780,
                        (key_type *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff798,(char *)rhs_expression,lhs,
             (unsigned_long *)in_stack_fffffffffffff780);
  line = (int)((ulong)in_stack_fffffffffffff798 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_760);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_01 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb7c5f9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,TVar3,file,line,(char *)rhs_expression);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0xb7c656);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7c6c1);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7c6ce);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7c6db);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}